

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param-nodes.cc
# Opt level: O1

Node * __thiscall
dynet::LookupNode::autobatch_pseudo_node
          (LookupNode *this,ComputationGraph *cg,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *batch_ids)

{
  uint *__args;
  _func_int **pp_Var1;
  LookupNode *this_00;
  _func_int **pp_Var2;
  Node *pNVar3;
  uint *puVar4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ids;
  uint word_id;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  uint local_44;
  uint *local_40;
  ComputationGraph *local_38;
  
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  puVar4 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  local_40 = (batch_ids->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
  local_38 = cg;
  if (puVar4 == local_40) {
    pNVar3 = (Node *)0x0;
  }
  else {
    do {
      pNVar3 = (local_38->nodes).super__Vector_base<dynet::Node_*,_std::allocator<dynet::Node_*>_>.
               _M_impl.super__Vector_impl_data._M_start[*puVar4];
      __args = *(uint **)((long)pNVar3[1].dim.d + 8);
      if (__args == (uint *)0x0) {
        pp_Var1 = *(_func_int ***)&(pNVar3[1].device)->device_id;
        for (pp_Var2 = (pNVar3[1].device)->_vptr_Device; pp_Var2 != pp_Var1;
            pp_Var2 = (_func_int **)((long)pp_Var2 + 4)) {
          local_44 = *(uint *)pp_Var2;
          if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                       (iterator)
                       local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&local_44);
          }
          else {
            *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = local_44;
            local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
      }
      else if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish ==
               local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_int,std::allocator<unsigned_int>>::
        _M_realloc_insert<unsigned_int_const&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,
                   (iterator)
                   local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish = *__args;
        local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      puVar4 = puVar4 + 1;
    } while (puVar4 != local_40);
  }
  this_00 = (LookupNode *)operator_new(0xb8);
  LookupNode(this_00,(LookupParameterStorage *)pNVar3[1].cg_,&local_68);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return (Node *)this_00;
}

Assistant:

Node* LookupNode::autobatch_pseudo_node(const ComputationGraph & cg,
                                        const std::vector<VariableIndex> & batch_ids) const {
  vector<unsigned> ids;
  LookupNode* ln = nullptr;
  for(auto batch_id : batch_ids) {
    ln = static_cast<LookupNode*>(cg.nodes[batch_id]);
    if(ln->pindex != nullptr)
      ids.push_back(*ln->pindex);
    else
      for(auto word_id : *ln->pindices)
        ids.push_back(word_id);
  }
  return new LookupNode(ln->params, ids);
}